

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoaderU.h
# Opt level: O0

shared_ptr<chrono::ChLoadable> __thiscall chrono::ChLoaderU::GetLoadable(ChLoaderU *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<chrono::ChLoadable> sVar1;
  ChLoaderU *this_local;
  
  std::shared_ptr<chrono::ChLoadable>::shared_ptr<chrono::ChLoadableU,void>
            ((shared_ptr<chrono::ChLoadable> *)this,
             (shared_ptr<chrono::ChLoadableU> *)(in_RSI + 0x18));
  sVar1.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<chrono::ChLoadable>)
         sVar1.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual std::shared_ptr<ChLoadable> GetLoadable() override { return loadable; }